

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::MeshLoader::loadTexBinormalSourceElement(MeshLoader *this,InputShared *input)

{
  bool bVar1;
  Semantic *pSVar2;
  ostream *poVar3;
  String *pSVar4;
  MeshLoader *this_00;
  MeshVertexData *vertexData;
  URI *this_01;
  InputUnshared *in_RSI;
  long in_RDI;
  MeshVertexData *colors;
  unsigned_long_long stride;
  SourceBase *sourceBase;
  String sourceId;
  URI inputUrl;
  Semantic semantic;
  bool retValue;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  MeshVertexData *in_stack_fffffffffffffe38;
  String *in_stack_fffffffffffffe40;
  SourceArrayLoader *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffeb0;
  undefined1 nofrag;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  URI *in_stack_fffffffffffffec0;
  string local_128 [32];
  URI local_108;
  Semantic local_20;
  bool local_19;
  InputUnshared *local_18;
  byte local_1;
  
  nofrag = (undefined1)((ulong)in_stack_fffffffffffffeb0 >> 0x38);
  local_19 = true;
  local_18 = in_RSI;
  pSVar2 = InputUnshared::getSemantic(in_RSI);
  local_20 = *pSVar2;
  if (local_20 == TEXBINORMAL) {
    InputUnshared::getSource(local_18);
    COLLADABU::URI::URI(in_stack_fffffffffffffec0,
                        (URI *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                        (bool)nofrag);
    pSVar4 = COLLADABU::URI::getFragment_abi_cxx11_(&local_108);
    std::__cxx11::string::string(local_128,(string *)pSVar4);
    this_00 = (MeshLoader *)
              SourceArrayLoader::getSourceById(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    if (this_00 == (MeshLoader *)0x0) {
      local_1 = 0;
    }
    else {
      bVar1 = SourceBase::isLoadedInputElement
                        ((SourceBase *)in_stack_fffffffffffffe48,
                         (Semantic *)in_stack_fffffffffffffe40);
      if (bVar1) {
        local_1 = 0;
      }
      else {
        vertexData = (MeshVertexData *)SourceBase::getStride((SourceBase *)this_00);
        if (vertexData == (MeshVertexData *)0x3) {
          in_stack_fffffffffffffe38 = COLLADAFW::Mesh::getBinormals(*(Mesh **)(in_RDI + 0xa0));
          in_stack_fffffffffffffe37 =
               appendVertexValues(this_00,(SourceBase *)
                                          CONCAT44(in_stack_fffffffffffffebc,
                                                   in_stack_fffffffffffffeb8),vertexData);
          local_19 = (bool)in_stack_fffffffffffffe37;
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"The binormal source ");
          this_01 = InputUnshared::getSource(local_18);
          pSVar4 = COLLADABU::URI::getURIString_abi_cxx11_(this_01);
          poVar3 = std::operator<<(poVar3,(string *)pSVar4);
          poVar3 = std::operator<<(poVar3," has a wrong dimension of ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulonglong)vertexData);
          poVar3 = std::operator<<(poVar3,". Dimensions must be 3.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          local_19 = false;
        }
        SourceBase::addLoadedInputElement
                  ((SourceBase *)in_stack_fffffffffffffe38,
                   (Semantic *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
        local_1 = local_19 & 1;
      }
    }
    std::__cxx11::string::~string(local_128);
    COLLADABU::URI::~URI((URI *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "The current input element is not a TEXBINORMAL element!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool MeshLoader::loadTexBinormalSourceElement ( const InputShared& input )
    {
        bool retValue = true;

        // Get the semantic of the current input element.
        InputSemantic::Semantic semantic = input.getSemantic ();
        if ( semantic != InputSemantic::TEXBINORMAL )
        {
            std::cerr << "The current input element is not a TEXBINORMAL element!" << std::endl;
            return false;
        }

        // Get the source element with the uri of the input element.
        COLLADABU::URI inputUrl = input.getSource ();
        String sourceId = inputUrl.getFragment ();
        SourceBase* sourceBase = getSourceById ( sourceId );
        if ( sourceBase == 0 ) return false;

        // Check if the source element is already loaded.
        if ( sourceBase->isLoadedInputElement ( semantic ) ) return false;

        // Get the stride of the uv coordinates. 
        // This is the dimension of the uv coordinates.
        // In depend on the dimension, we store the coordinates in the mesh.
        unsigned long long stride = sourceBase->getStride ();
        if ( stride !=  3 )
        {
            std::cerr << "The binormal source " <<  input.getSource().getURIString () 
                << " has a wrong dimension of " << stride 
                << ". Dimensions must be 3." << std::endl;
            retValue = false;
        }
        else
        {
            COLLADAFW::MeshVertexData& colors = mMesh->getBinormals ();
            retValue = appendVertexValues ( sourceBase, colors );
        }

        // Set the source base as loaded element.
        sourceBase->addLoadedInputElement ( semantic );

        return retValue;
    }